

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rco.cpp
# Opt level: O0

void __thiscall RCO::RCO(RCO *this,uint8_t *buffer,uint32_t bufferLen)

{
  RCOError RVar1;
  uint32_t bufferLen_local;
  uint8_t *buffer_local;
  RCO *this_local;
  
  this->mBuffer = buffer;
  this->mBufferLen = bufferLen;
  this->mVerbose = true;
  this->mIsRCSF = false;
  this->mRCOErrno = 0;
  RCOElement::RCOElement(&this->mRootElement);
  std::
  unordered_map<int,_RCOElement,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_RCOElement>_>_>
  ::unordered_map(&this->mElements);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RCOFileData,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RCOFileData>_>_>
  ::unordered_map(&this->mFiles);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RCOElement,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RCOElement>_>_>
  ::unordered_map(&this->mStringTable);
  RVar1 = loadHeader(this);
  this->mRCOErrno = RVar1;
  if (this->mRCOErrno == 0) {
    RVar1 = loadElement(this,&this->mRootElement,(this->mHeader).tree_start_off);
    this->mRCOErrno = RVar1;
    if (this->mRCOErrno != 0) {
      printf("Error!\n");
    }
  }
  return;
}

Assistant:

RCO::RCO(uint8_t *buffer, uint32_t bufferLen) : mBuffer(buffer), mBufferLen(bufferLen)
{
	mRCOErrno = loadHeader();
	if (mRCOErrno != NO_ERROR)
		return;

	mRCOErrno = loadElement(mRootElement, mHeader.tree_start_off);

	if (mRCOErrno != NO_ERROR)
		printf("Error!\n");
}